

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferObjectQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::anon_unknown_2::BufferCase::test(BufferCase *this)

{
  GLuint local_24;
  int local_20;
  GLuint bufferId;
  int ndx;
  int targets;
  GLenum bufferTargets [2];
  BufferCase *this_local;
  
  bufferTargets = (GLenum  [2])this;
  _ndx = 0x889300008892;
  bufferId = 2;
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    this->m_bufferTarget = (&ndx)[local_20];
    local_24 = 0;
    glu::CallLogWrapper::glGenBuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_24);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ApiCase).super_CallLogWrapper,this->m_bufferTarget,local_24);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])();
    glu::CallLogWrapper::glDeleteBuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_24);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		const GLenum bufferTargets[] =
		{
			GL_ARRAY_BUFFER, GL_ELEMENT_ARRAY_BUFFER
		};
		const int targets = DE_LENGTH_OF_ARRAY(bufferTargets);

		for (int ndx = 0; ndx < targets; ++ndx)
		{
			m_bufferTarget = bufferTargets[ndx];

			GLuint bufferId = 0;
			glGenBuffers(1, &bufferId);
			glBindBuffer(m_bufferTarget, bufferId);
			expectError(GL_NO_ERROR);

			testBuffer();

			glDeleteBuffers(1, &bufferId);
			expectError(GL_NO_ERROR);
		}
	}